

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

int uttamarin::EditDistance(string *A,string *B)

{
  size_type __n;
  int iVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dp;
  allocator_type local_56;
  allocator_type local_55;
  value_type_conflict1 local_54;
  vector<int,_std::allocator<int>_> local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_38;
  
  __n = A->_M_string_length;
  local_54 = -1;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,B->_M_string_length,&local_54,&local_55);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_38,__n,&local_50,&local_56);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar1 = EditDistanceHelper(A,0,B,0,&local_38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_38);
  return iVar1;
}

Assistant:

int EditDistance(const string& A, const string B) { 
  vector<vector<int>> dp(A.size(), vector<int>(B.size(), -1)); 
  return EditDistanceHelper(A, 0, B, 0, dp); 
}